

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

void duckdb::ArraySliceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  Vector VVar2;
  UnifiedVectorFormat *pUVar3;
  list_entry_t *plVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  Vector *pVVar14;
  idx_t iVar15;
  idx_t iVar16;
  long *plVar17;
  long *plVar18;
  long *plVar19;
  idx_t iVar20;
  SelectionVector *pSVar21;
  NotImplementedException *this;
  UnifiedVectorFormat *pUVar22;
  long *plVar23;
  UnifiedVectorFormat *pUVar24;
  TemplatedValidityMask<unsigned_long> *pTVar25;
  UnifiedVectorFormat *pUVar26;
  UnifiedVectorFormat *extraout_RDX;
  UnifiedVectorFormat *extraout_RDX_00;
  TemplatedValidityMask<unsigned_long> *pTVar27;
  byte bVar28;
  idx_t i;
  ulong uVar29;
  long lVar30;
  UnifiedVectorFormat *pUVar31;
  sel_t sVar32;
  UnifiedVectorFormat *pUVar33;
  idx_t i_2;
  anon_union_16_2_67f50693_for_value *paVar34;
  uint64_t uVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  list_entry_t input_07;
  list_entry_t input_08;
  list_entry_t lVar40;
  anon_union_16_2_67f50693_for_value aVar41;
  list_entry_t lVar42;
  undefined6 in_stack_fffffffffffffe18;
  FunctionData FVar43;
  FunctionData FVar44;
  optional_ptr<duckdb::Vector,_true> local_1d0;
  list_entry_t sliced;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  anon_union_16_2_67f50693_for_value *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  SelectionVector sel;
  long local_180;
  idx_t local_178;
  optional_ptr<duckdb::Vector,_true> local_170;
  TemplatedValidityMask<unsigned_long> *local_168;
  TemplatedValidityMask<unsigned_long> *local_160;
  list_entry_t str;
  long local_148;
  UnifiedVectorFormat step_data;
  long local_100;
  long local_f8;
  UnifiedVectorFormat begin_data;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat end_data;
  long local_70;
  long local_68;
  
  pUVar3 = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  duckdb::VectorOperations::Copy(pvVar9,result,(ulong)pUVar3,0,0);
  if (result[8] == (Vector)0x1) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  pvVar9 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  pvVar10 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,2);
  if (*(long *)(args + 8) - *(long *)args == 0x1a0) {
    pvVar11 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,3);
  }
  else {
    pvVar11 = (reference)0x0;
  }
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(pBVar12 + 0x198));
  FVar43 = pFVar13[0x20];
  FVar44 = pFVar13[0x21];
  duckdb::DataChunk::AllConstant();
  duckdb::Vector::SetVectorType((VectorType)result);
  VVar2 = result[8];
  if (VVar2 != (Vector)0x19) {
    if (VVar2 == (Vector)0x1a) {
      if (pvVar11 == (reference)0x0) {
        pVVar14 = (Vector *)0x0;
      }
      else {
        pVVar14 = (Vector *)duckdb::ListVector::GetEntry(result);
      }
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_178 = 0;
      sel.sel_vector = (sel_t *)0x0;
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (*result == (Vector)0x2) {
        if (*(byte **)(result + 0x28) == (byte *)0x0) {
          bVar37 = false;
        }
        else {
          bVar37 = (**(byte **)(result + 0x28) & 1) == 0;
        }
        if (*(byte **)(pvVar9 + 0x28) == (byte *)0x0) {
          bVar38 = false;
        }
        else {
          bVar38 = (**(byte **)(pvVar9 + 0x28) & 1) == 0;
        }
        if (*(byte **)(pvVar10 + 0x28) == (byte *)0x0) {
          bVar39 = false;
        }
        else {
          bVar39 = (**(byte **)(pvVar10 + 0x28) & 1) == 0;
        }
        _end_data = pVVar14;
        if (pvVar11 == (reference)0x0) {
          bVar28 = 0;
          _begin_data = pvVar11;
        }
        else {
          _begin_data = pvVar11;
          pVVar14 = optional_ptr<duckdb::Vector,_true>::operator*
                              ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          if (*(byte **)(pVVar14 + 0x28) == (byte *)0x0) {
            bVar28 = 1;
          }
          else {
            bVar28 = **(byte **)(pVVar14 + 0x28) & 1;
          }
        }
        if (((bVar37 || bVar38) || bVar39) || (_begin_data != (reference)0x0 && bVar28 == 0)) {
          duckdb::ConstantVector::SetNull(result,true);
        }
        else {
          local_1b0 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
          puVar5 = *(undefined8 **)(pvVar9 + 0x20);
          puVar6 = *(undefined8 **)(pvVar10 + 0x20);
          if (_begin_data == (reference)0x0) {
            plVar17 = (long *)0x0;
          }
          else {
            pVVar14 = optional_ptr<duckdb::Vector,_true>::operator*
                                ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
            plVar17 = *(long **)(pVVar14 + 0x20);
          }
          uVar7 = *(ulong *)local_1b0;
          str.length = (uint64_t)(local_1b0->pointer).ptr;
          str.offset._0_4_ = (undefined4)uVar7;
          str.offset._4_4_ = (undefined4)(uVar7 >> 0x20);
          if (FVar43 == (FunctionData)0x0) {
            _step_data = (long *)*puVar5;
          }
          else {
            _step_data = (long *)0x0;
          }
          if (FVar44 == (FunctionData)0x0) {
            plVar19 = (long *)*puVar6;
            plVar18 = plVar19;
          }
          else {
            plVar19 = (long *)0x0;
            plVar18 = (long *)(uVar7 & 0xffffffff);
          }
          sliced.offset._0_4_ = SUB84(plVar18,0);
          sliced.offset._4_4_ = (undefined4)((ulong)plVar18 >> 0x20);
          bVar37 = true;
          if (plVar17 == (long *)0x0) {
            lVar30 = 1;
            bVar38 = true;
LAB_00720778:
            ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                      ((string_t *)&str,(long *)&step_data,(long *)&sliced);
          }
          else {
            lVar30 = *plVar17;
            if (lVar30 < 0) {
              if (FVar43 != (FunctionData)0x0) {
                _step_data = (long *)(uVar7 & 0xffffffff);
              }
              sliced.offset._0_4_ = SUB84(_step_data,0);
              sliced.offset._4_4_ = (undefined4)((ulong)_step_data >> 0x20);
              _step_data = plVar19;
            }
            bVar38 = lVar30 == 1;
            if ((bVar28 | bVar38) == 1) goto LAB_00720778;
            bVar37 = false;
            bVar38 = false;
          }
          if ((bVar28 == 1 && lVar30 != 1) &&
             ((long)_step_data < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
            iVar20 = CalculateSliceLength<long>
                               ((idx_t)_step_data,
                                CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar30,true)
            ;
            bVar39 = true;
            SelectionVector::Initialize(&sel,iVar20);
          }
          else {
            bVar39 = false;
            iVar20 = 0;
          }
          if (bVar37) {
            input_04.value._4_1_ = str.offset._4_1_;
            input_04.value._5_1_ = str.offset._5_1_;
            input_04.value._6_1_ = str.offset._6_1_;
            input_04.value._7_1_ = str.offset._7_1_;
            input_04.value.pointer.length = (undefined4)str.offset;
            input_04.value.pointer.ptr = (char *)str.length;
            input_03.value._4_1_ = str.offset._4_1_;
            input_03.value._5_1_ = str.offset._5_1_;
            input_03.value._6_1_ = str.offset._6_1_;
            input_03.value._7_1_ = str.offset._7_1_;
            input_03.value.pointer.length = (undefined4)str.offset;
            input_03.value.pointer.ptr = (char *)str.length;
            if (bVar38) {
              aVar41.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   BlobSliceOperations::SliceValue
                             (result,input_03,(int64_t)_step_data,
                              CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset));
            }
            else {
              aVar41.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   BlobSliceOperations::SliceValueWithSteps
                             (result,&sel,input_04,(int64_t)_step_data,
                              CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar30,
                              &local_178);
            }
            local_1b0->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar41;
          }
          else {
            duckdb::ConstantVector::SetNull(result,true);
          }
          if (bVar39) {
            pSVar21 = (SelectionVector *)
                      optional_ptr<duckdb::Vector,_true>::operator->
                                ((optional_ptr<duckdb::Vector,_true> *)&end_data);
            duckdb::Vector::Slice(pSVar21,(ulong)&sel);
            pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->
                                ((optional_ptr<duckdb::Vector,_true> *)&end_data);
            duckdb::Vector::Flatten((ulong)pVVar14);
            duckdb::ListVector::SetListSize(result,iVar20);
          }
        }
      }
      else {
        local_1d0.ptr = pvVar11;
        local_170.ptr = pVVar14;
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
        duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar3);
        duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar3);
        duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar3);
        if (local_1d0.ptr != (reference)0x0) {
          pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->(&local_1d0);
          duckdb::Vector::ToUnifiedFormat((ulong)pVVar14,pUVar3);
          iVar20 = duckdb::ListVector::GetListSize(result);
          SelectionVector::Initialize(&sel,iVar20);
        }
        lVar30 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        paVar34 = (anon_union_16_2_67f50693_for_value *)(lVar30 + 8);
        local_168 = (TemplatedValidityMask<unsigned_long> *)0x0;
        for (pUVar31 = (UnifiedVectorFormat *)0x0; pTVar27 = local_168, pUVar3 != pUVar31;
            pUVar31 = pUVar31 + 1) {
          pUVar22 = pUVar31;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            pUVar22 = (UnifiedVectorFormat *)
                      (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                      (long)pUVar31 * 4);
          }
          pUVar33 = pUVar31;
          if (*(long *)_begin_data != 0) {
            pUVar33 = (UnifiedVectorFormat *)
                      (ulong)*(uint *)(*(long *)_begin_data + (long)pUVar31 * 4);
          }
          pUVar26 = pUVar31;
          if (*(long *)_end_data != 0) {
            pUVar26 = (UnifiedVectorFormat *)
                      (ulong)*(uint *)(*(long *)_end_data + (long)pUVar31 * 4);
          }
          if (local_1d0.ptr == (reference)0x0) {
            pUVar24 = (UnifiedVectorFormat *)0x0;
          }
          else {
            pUVar24 = pUVar31;
            if (*_step_data != 0) {
              pUVar24 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_step_data + (long)pUVar31 * 4);
            }
          }
          if (local_148 == 0) {
            bVar37 = false;
          }
          else {
            bVar37 = (*(ulong *)(local_148 + ((ulong)pUVar22 >> 6) * 8) >> ((ulong)pUVar22 & 0x3f) &
                     1) == 0;
          }
          if (local_b0 == 0) {
            bVar38 = false;
          }
          else {
            bVar38 = (*(ulong *)(local_b0 + ((ulong)pUVar33 >> 6) * 8) >> ((ulong)pUVar33 & 0x3f) &
                     1) == 0;
          }
          if (local_68 == 0) {
            bVar39 = false;
          }
          else {
            bVar39 = (*(ulong *)(local_68 + ((ulong)pUVar26 >> 6) * 8) >> ((ulong)pUVar26 & 0x3f) &
                     1) == 0;
          }
          if (local_1d0.ptr == (reference)0x0) {
            bVar36 = false;
          }
          else if (local_f8 == 0) {
            bVar36 = true;
          }
          else {
            bVar36 = (*(ulong *)(local_f8 + ((ulong)pUVar24 >> 6) * 8) >> ((ulong)pUVar24 & 0x3f) &
                     1) != 0;
          }
          local_1b0 = paVar34;
          if (((bVar37 || bVar38) || bVar39) || (local_1d0.ptr != (reference)0x0 && bVar36 == false)
             ) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar31);
          }
          else {
            puVar1 = (ulong *)(str.length + (long)pUVar22 * 0x10);
            uVar7 = *puVar1;
            sliced.length = puVar1[1];
            sliced.offset._0_4_ = (undefined4)uVar7;
            sliced.offset._4_4_ = (undefined4)(uVar7 >> 0x20);
            if (FVar43 == (FunctionData)0x0) {
              local_1a0 = *(ulong *)(local_b8 + (long)pUVar33 * 8);
            }
            else {
              local_1a0 = 0;
            }
            if (FVar44 == (FunctionData)0x0) {
              local_1a8 = *(ulong *)(local_70 + (long)pUVar26 * 8);
              uVar29 = local_1a8;
            }
            else {
              local_1a8 = uVar7 & 0xffffffff;
              uVar29 = 0;
            }
            lVar30 = 1;
            if (local_1d0.ptr == (reference)0x0) {
LAB_0071f847:
              ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                        ((string_t *)&sliced,(long *)&local_1a0,(long *)&local_1a8);
              bVar37 = true;
            }
            else {
              lVar30 = *(long *)(local_100 + (long)pUVar24 * 8);
              if ((lVar30 < 0) &&
                 (local_1a8 = local_1a0, local_1a0 = uVar29, FVar43 != (FunctionData)0x0)) {
                local_1a8 = uVar7 & 0xffffffff;
              }
              if ((~bVar36 & lVar30 != 1) == 0) goto LAB_0071f847;
              bVar37 = false;
            }
            uVar29 = local_1a0;
            uVar7 = local_1a8;
            if ((long)local_1a0 < (long)local_1a8) {
              iVar20 = CalculateSliceLength<long>(local_1a0,local_1a8,lVar30,bVar36);
            }
            else {
              iVar20 = 0;
            }
            if (bVar37) {
              input_00.value._4_1_ = sliced.offset._4_1_;
              input_00.value._5_1_ = sliced.offset._5_1_;
              input_00.value._6_1_ = sliced.offset._6_1_;
              input_00.value._7_1_ = sliced.offset._7_1_;
              input_00.value.pointer.length = (undefined4)sliced.offset;
              input_00.value.pointer.ptr = (char *)sliced.length;
              input.value._4_1_ = sliced.offset._4_1_;
              input.value._5_1_ = sliced.offset._5_1_;
              input.value._6_1_ = sliced.offset._6_1_;
              input.value._7_1_ = sliced.offset._7_1_;
              input.value.pointer.length = (undefined4)sliced.offset;
              input.value.pointer.ptr = (char *)sliced.length;
              if (local_1d0.ptr == (reference)0x0) {
                aVar41.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     BlobSliceOperations::SliceValue(result,input_00,uVar29,uVar7);
              }
              else {
                aVar41.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     BlobSliceOperations::SliceValueWithSteps
                               (result,&sel,input,uVar29,uVar7,lVar30,&local_178);
              }
              *(long *)((long)local_1b0 + -8) = aVar41._0_8_;
              *(char **)local_1b0 = aVar41.pointer.ptr;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar31);
            }
            local_168 = (TemplatedValidityMask<unsigned_long> *)
                        ((long)&local_168->validity_mask + iVar20);
          }
          paVar34 = local_1b0 + 1;
        }
        if (local_1d0.ptr != (reference)0x0) {
          SelectionVector::SelectionVector((SelectionVector *)&sliced,(idx_t)local_168);
          for (pTVar25 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar27 != pTVar25;
              pTVar25 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar25->validity_mask + 1))
          {
            sVar32 = (sel_t)pTVar25;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar32 = sel.sel_vector[(long)pTVar25];
            }
            *(sel_t *)(CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) + (long)pTVar25 * 4)
                 = sVar32;
          }
          pSVar21 = (SelectionVector *)optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
          duckdb::Vector::Slice(pSVar21,(ulong)&sliced);
          pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
          duckdb::Vector::Flatten((ulong)pVVar14);
          duckdb::ListVector::SetListSize(result,(ulong)pTVar27);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&step_data);
        UnifiedVectorFormat::~UnifiedVectorFormat(&end_data);
        UnifiedVectorFormat::~UnifiedVectorFormat(&begin_data);
        UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      }
      duckdb::Vector::Verify((ulong)result);
      goto LAB_00720593;
    }
    if (VVar2 != (Vector)0x65) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&str,"Specifier type not implemented",(allocator *)&begin_data);
      duckdb::NotImplementedException::NotImplementedException(this,(string *)&str);
      __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((byte)*result & 0xfd) != 0) {
      duckdb::Vector::Flatten((ulong)result);
    }
    if (pvVar11 == (reference)0x0) {
      pVVar14 = (Vector *)0x0;
    }
    else {
      pVVar14 = (Vector *)duckdb::ListVector::GetEntry(result);
    }
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = 0;
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (*result == (Vector)0x2) {
      if (*(byte **)(result + 0x28) == (byte *)0x0) {
        bVar37 = false;
      }
      else {
        bVar37 = (**(byte **)(result + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar9 + 0x28) == (byte *)0x0) {
        bVar38 = false;
      }
      else {
        bVar38 = (**(byte **)(pvVar9 + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar10 + 0x28) == (byte *)0x0) {
        bVar39 = false;
      }
      else {
        bVar39 = (**(byte **)(pvVar10 + 0x28) & 1) == 0;
      }
      _end_data = pVVar14;
      if (pvVar11 == (reference)0x0) {
        bVar28 = 0;
        _begin_data = pvVar11;
      }
      else {
        _begin_data = pvVar11;
        pVVar14 = optional_ptr<duckdb::Vector,_true>::operator*
                            ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        if (*(byte **)(pVVar14 + 0x28) == (byte *)0x0) {
          bVar28 = 1;
        }
        else {
          bVar28 = **(byte **)(pVVar14 + 0x28) & 1;
        }
      }
      if (((bVar37 || bVar38) || bVar39) || (_begin_data != (reference)0x0 && bVar28 == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
      }
      else {
        plVar4 = *(list_entry_t **)(result + 0x20);
        puVar5 = *(undefined8 **)(pvVar9 + 0x20);
        puVar6 = *(undefined8 **)(pvVar10 + 0x20);
        if (_begin_data == (reference)0x0) {
          plVar17 = (long *)0x0;
        }
        else {
          pVVar14 = optional_ptr<duckdb::Vector,_true>::operator*
                              ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          plVar17 = *(long **)(pVVar14 + 0x20);
        }
        str.length = plVar4->length;
        str.offset._0_4_ = (undefined4)plVar4->offset;
        str.offset._4_4_ = (undefined4)(plVar4->offset >> 0x20);
        if (FVar43 == (FunctionData)0x0) {
          _step_data = (long *)*puVar5;
        }
        else {
          _step_data = (long *)0x0;
        }
        if (FVar44 == (FunctionData)0x0) {
          plVar19 = (long *)*puVar6;
          plVar18 = plVar19;
        }
        else {
          plVar19 = (long *)0x0;
          plVar18 = (long *)str.length;
        }
        sliced.offset._0_4_ = SUB84(plVar18,0);
        sliced.offset._4_4_ = (undefined4)((ulong)plVar18 >> 0x20);
        bVar37 = true;
        if (plVar17 == (long *)0x0) {
          lVar30 = 1;
          bVar38 = true;
LAB_00720838:
          ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                    (&str,(long *)&step_data,(long *)&sliced);
        }
        else {
          lVar30 = *plVar17;
          if (lVar30 < 0) {
            if (FVar43 != (FunctionData)0x0) {
              _step_data = (long *)str.length;
            }
            sliced.offset._0_4_ = SUB84(_step_data,0);
            sliced.offset._4_4_ = (undefined4)((ulong)_step_data >> 0x20);
            _step_data = plVar19;
          }
          bVar38 = lVar30 == 1;
          if ((bVar28 | bVar38) == 1) goto LAB_00720838;
          bVar37 = false;
          bVar38 = false;
        }
        if ((bVar28 == 1 && lVar30 != 1) &&
           ((long)_step_data < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
          iVar20 = CalculateSliceLength<long>
                             ((idx_t)_step_data,
                              CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar30,true);
          bVar39 = true;
          SelectionVector::Initialize(&sel,iVar20);
        }
        else {
          bVar39 = false;
          iVar20 = 0;
        }
        if (bVar37) {
          if (bVar38) {
            lVar42.length =
                 CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) - (long)_step_data;
            lVar42.offset =
                 (long)&((SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset))->
                        sel_vector + (long)_step_data;
          }
          else {
            input_08.length = (uint64_t)_step_data;
            input_08.offset = str.length;
            lVar42 = ListSliceOperations::SliceValueWithSteps
                               ((ListSliceOperations *)result,(Vector *)&sel,
                                (SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset)
                                ,input_08,CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),
                                lVar30,(int64_t)&local_178,
                                (idx_t *)CONCAT17(FVar44,CONCAT16(FVar43,in_stack_fffffffffffffe18))
                               );
          }
          *plVar4 = lVar42;
        }
        else {
          duckdb::ConstantVector::SetNull(result,true);
        }
        if (bVar39) {
          pSVar21 = (SelectionVector *)
                    optional_ptr<duckdb::Vector,_true>::operator->
                              ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          duckdb::Vector::Slice(pSVar21,(ulong)&sel);
          pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->
                              ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          duckdb::Vector::Flatten((ulong)pVVar14);
          duckdb::ListVector::SetListSize(result,iVar20);
        }
      }
    }
    else {
      local_1d0.ptr = pvVar11;
      local_170.ptr = pVVar14;
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
      duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar3);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar3);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar3);
      if (local_1d0.ptr != (reference)0x0) {
        pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->(&local_1d0);
        duckdb::Vector::ToUnifiedFormat((ulong)pVVar14,pUVar3);
        iVar20 = duckdb::ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar20);
      }
      lVar30 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      local_168 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
      paVar34 = (anon_union_16_2_67f50693_for_value *)(lVar30 + 8);
      local_160 = (TemplatedValidityMask<unsigned_long> *)0x0;
      for (pUVar31 = (UnifiedVectorFormat *)0x0; pTVar27 = local_160, pUVar3 != pUVar31;
          pUVar31 = pUVar31 + 1) {
        pUVar22 = pUVar31;
        if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
          pUVar22 = (UnifiedVectorFormat *)
                    (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                    (long)pUVar31 * 4);
        }
        pUVar33 = pUVar31;
        if (*(long *)_begin_data != 0) {
          pUVar33 = (UnifiedVectorFormat *)
                    (ulong)*(uint *)(*(long *)_begin_data + (long)pUVar31 * 4);
        }
        pUVar26 = pUVar31;
        if (*(long *)_end_data != 0) {
          pUVar26 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)_end_data + (long)pUVar31 * 4);
        }
        if (local_1d0.ptr == (reference)0x0) {
          pUVar24 = (UnifiedVectorFormat *)0x0;
        }
        else {
          pUVar24 = pUVar31;
          if (*_step_data != 0) {
            pUVar24 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_step_data + (long)pUVar31 * 4);
          }
        }
        if (local_148 == 0) {
          bVar37 = false;
        }
        else {
          bVar37 = (*(ulong *)(local_148 + ((ulong)pUVar22 >> 6) * 8) >> ((ulong)pUVar22 & 0x3f) & 1
                   ) == 0;
        }
        if (local_b0 == 0) {
          bVar38 = false;
        }
        else {
          bVar38 = (*(ulong *)(local_b0 + ((ulong)pUVar33 >> 6) * 8) >> ((ulong)pUVar33 & 0x3f) & 1)
                   == 0;
        }
        if (local_68 == 0) {
          bVar39 = false;
        }
        else {
          bVar39 = (*(ulong *)(local_68 + ((ulong)pUVar26 >> 6) * 8) >> ((ulong)pUVar26 & 0x3f) & 1)
                   == 0;
        }
        if (local_1d0.ptr == (reference)0x0) {
          bVar36 = false;
        }
        else if (local_f8 == 0) {
          bVar36 = true;
        }
        else {
          bVar36 = (*(ulong *)(local_f8 + ((ulong)pUVar24 >> 6) * 8) >> ((ulong)pUVar24 & 0x3f) & 1)
                   != 0;
        }
        local_1b0 = paVar34;
        if (((bVar37 || bVar38) || bVar39) || (local_1d0.ptr != (reference)0x0 && bVar36 == false))
        {
          TemplatedValidityMask<unsigned_long>::SetInvalid(local_168,(idx_t)pUVar31);
        }
        else {
          puVar5 = (undefined8 *)(str.length + (long)pUVar22 * 0x10);
          uVar8 = *puVar5;
          sliced.length = puVar5[1];
          sliced.offset._0_4_ = (undefined4)uVar8;
          sliced.offset._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
          if (FVar43 == (FunctionData)0x0) {
            local_1a0 = *(uint64_t *)(local_b8 + (long)pUVar33 * 8);
          }
          else {
            local_1a0 = 0;
          }
          if (FVar44 == (FunctionData)0x0) {
            local_1a8 = *(uint64_t *)(local_70 + (long)pUVar26 * 8);
            uVar35 = local_1a8;
          }
          else {
            local_1a8 = sliced.length;
            uVar35 = 0;
          }
          local_180 = 1;
          if (local_1d0.ptr == (reference)0x0) {
LAB_007200a6:
            ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                      (&sliced,(long *)&local_1a0,(long *)&local_1a8);
            bVar37 = true;
            pUVar24 = extraout_RDX;
          }
          else {
            local_180 = *(long *)(local_100 + (long)pUVar24 * 8);
            if ((local_180 < 0) &&
               (local_1a8 = local_1a0, local_1a0 = uVar35, FVar43 != (FunctionData)0x0)) {
              local_1a8 = sliced.length;
            }
            if ((~bVar36 & local_180 != 1) == 0) goto LAB_007200a6;
            bVar37 = false;
          }
          uVar29 = local_1a0;
          uVar7 = local_1a8;
          uVar35 = local_1a8 - local_1a0;
          if (uVar35 == 0 || (long)local_1a8 < (long)local_1a0) {
            iVar20 = 0;
          }
          else {
            iVar20 = CalculateSliceLength<long>(local_1a0,local_1a8,local_180,bVar36);
            pUVar24 = extraout_RDX_00;
          }
          if (bVar37) {
            if (local_1d0.ptr == (reference)0x0) {
              lVar40.length = (uint64_t)pUVar24;
              lVar40.offset =
                   (long)&((SelectionVector *)
                          CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))->sel_vector +
                   uVar29;
            }
            else {
              input_07.length = uVar29;
              input_07.offset = sliced.length;
              lVar40 = ListSliceOperations::SliceValueWithSteps
                                 ((ListSliceOperations *)result,(Vector *)&sel,
                                  (SelectionVector *)
                                  CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),input_07,
                                  uVar7,local_180,(int64_t)&local_178,
                                  (idx_t *)CONCAT17(FVar44,CONCAT16(FVar43,in_stack_fffffffffffffe18
                                                                   )));
              uVar35 = lVar40.length;
            }
            *(uint64_t *)((long)local_1b0 + -8) = lVar40.offset;
            *(uint64_t *)local_1b0 = uVar35;
          }
          else {
            TemplatedValidityMask<unsigned_long>::SetInvalid(local_168,(idx_t)pUVar31);
          }
          local_160 = (TemplatedValidityMask<unsigned_long> *)
                      ((long)&local_160->validity_mask + iVar20);
        }
        paVar34 = local_1b0 + 1;
      }
      if (local_1d0.ptr != (reference)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&sliced,(idx_t)local_160);
        for (pTVar25 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar27 != pTVar25;
            pTVar25 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar25->validity_mask + 1)) {
          sVar32 = (sel_t)pTVar25;
          if (sel.sel_vector != (sel_t *)0x0) {
            sVar32 = sel.sel_vector[(long)pTVar25];
          }
          *(sel_t *)(CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) + (long)pTVar25 * 4) =
               sVar32;
        }
        pSVar21 = (SelectionVector *)optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
        duckdb::Vector::Slice(pSVar21,(ulong)&sliced);
        pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
        duckdb::Vector::Flatten((ulong)pVVar14);
        duckdb::ListVector::SetListSize(result,(ulong)pTVar27);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&step_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&str);
    }
    duckdb::Vector::Verify((ulong)result);
    goto LAB_00720593;
  }
  if (pvVar11 == (reference)0x0) {
    pVVar14 = (Vector *)0x0;
  }
  else {
    pVVar14 = (Vector *)duckdb::ListVector::GetEntry(result);
  }
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178 = 0;
  sel.sel_vector = (sel_t *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (*result == (Vector)0x2) {
    if (*(byte **)(result + 0x28) == (byte *)0x0) {
      bVar37 = false;
    }
    else {
      bVar37 = (**(byte **)(result + 0x28) & 1) == 0;
    }
    if (*(byte **)(pvVar9 + 0x28) == (byte *)0x0) {
      bVar38 = false;
    }
    else {
      bVar38 = (**(byte **)(pvVar9 + 0x28) & 1) == 0;
    }
    if (*(byte **)(pvVar10 + 0x28) == (byte *)0x0) {
      bVar39 = false;
    }
    else {
      bVar39 = (**(byte **)(pvVar10 + 0x28) & 1) == 0;
    }
    _end_data = pVVar14;
    if (pvVar11 == (reference)0x0) {
      bVar28 = 0;
      _begin_data = pvVar11;
    }
    else {
      _begin_data = pvVar11;
      pVVar14 = optional_ptr<duckdb::Vector,_true>::operator*
                          ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
      if (*(byte **)(pVVar14 + 0x28) == (byte *)0x0) {
        bVar28 = 1;
      }
      else {
        bVar28 = **(byte **)(pVVar14 + 0x28) & 1;
      }
    }
    if (((bVar37 || bVar38) || bVar39) || (_begin_data != (reference)0x0 && bVar28 == 0)) {
      duckdb::ConstantVector::SetNull(result,true);
    }
    else {
      paVar34 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
      puVar5 = *(undefined8 **)(pvVar9 + 0x20);
      puVar6 = *(undefined8 **)(pvVar10 + 0x20);
      if (_begin_data == (reference)0x0) {
        plVar17 = (long *)0x0;
      }
      else {
        pVVar14 = optional_ptr<duckdb::Vector,_true>::operator*
                            ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        plVar17 = *(long **)(pVVar14 + 0x20);
      }
      str.length = (uint64_t)(paVar34->pointer).ptr;
      str.offset._0_4_ = (undefined4)*(undefined8 *)paVar34;
      str.offset._4_4_ = (undefined4)((ulong)*(undefined8 *)paVar34 >> 0x20);
      if (FVar43 == (FunctionData)0x0) {
        plVar19 = (long *)*puVar5;
      }
      else {
        plVar19 = (long *)0x0;
      }
      _step_data = plVar19;
      if (FVar44 == (FunctionData)0x0) {
        plVar18 = (long *)*puVar6;
        plVar23 = plVar18;
      }
      else {
        plVar18 = (long *)StringSliceOperations::ValueLength((string_t *)&str);
        plVar23 = (long *)0x0;
      }
      sliced.offset._0_4_ = SUB84(plVar18,0);
      sliced.offset._4_4_ = (undefined4)((ulong)plVar18 >> 0x20);
      bVar37 = true;
      if (plVar17 == (long *)0x0) {
        lVar30 = 1;
        bVar38 = true;
LAB_007208df:
        ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                  ((string_t *)&str,(long *)&step_data,(long *)&sliced);
      }
      else {
        lVar30 = *plVar17;
        if (lVar30 < 0) {
          _step_data = plVar23;
          if (FVar43 != (FunctionData)0x0) {
            plVar19 = (long *)StringSliceOperations::ValueLength((string_t *)&str);
          }
          sliced.offset._0_4_ = SUB84(plVar19,0);
          sliced.offset._4_4_ = (undefined4)((ulong)plVar19 >> 0x20);
        }
        bVar38 = lVar30 == 1;
        if ((bVar28 | bVar38) == 1) goto LAB_007208df;
        bVar37 = false;
        bVar38 = false;
      }
      if ((bVar28 == 1 && lVar30 != 1) &&
         ((long)_step_data < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
        iVar20 = CalculateSliceLength<long>
                           ((idx_t)_step_data,
                            CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar30,true);
        bVar39 = true;
        SelectionVector::Initialize(&sel,iVar20);
      }
      else {
        bVar39 = false;
        iVar20 = 0;
      }
      if (bVar37) {
        input_06.value._4_1_ = str.offset._4_1_;
        input_06.value._5_1_ = str.offset._5_1_;
        input_06.value._6_1_ = str.offset._6_1_;
        input_06.value._7_1_ = str.offset._7_1_;
        input_06.value.pointer.length = (undefined4)str.offset;
        input_06.value.pointer.ptr = (char *)str.length;
        input_05.value._4_1_ = str.offset._4_1_;
        input_05.value._5_1_ = str.offset._5_1_;
        input_05.value._6_1_ = str.offset._6_1_;
        input_05.value._7_1_ = str.offset._7_1_;
        input_05.value.pointer.length = (undefined4)str.offset;
        input_05.value.pointer.ptr = (char *)str.length;
        if (bVar38) {
          aVar41.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringSliceOperations::SliceValue
                         (result,input_05,(int64_t)_step_data,
                          CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset));
        }
        else {
          aVar41.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringSliceOperations::SliceValueWithSteps
                         (result,&sel,input_06,(int64_t)_step_data,
                          CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar30,&local_178)
          ;
        }
        paVar34->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar41;
      }
      else {
        duckdb::ConstantVector::SetNull(result,true);
      }
      if (bVar39) {
        pSVar21 = (SelectionVector *)
                  optional_ptr<duckdb::Vector,_true>::operator->
                            ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        duckdb::Vector::Slice(pSVar21,(ulong)&sel);
        pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->
                            ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        duckdb::Vector::Flatten((ulong)pVVar14);
        duckdb::ListVector::SetListSize(result,iVar20);
      }
    }
  }
  else {
    local_1d0.ptr = pvVar11;
    local_170.ptr = pVVar14;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&step_data);
    duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar3);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar3);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar3);
    if (local_1d0.ptr != (reference)0x0) {
      pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->(&local_1d0);
      duckdb::Vector::ToUnifiedFormat((ulong)pVVar14,pUVar3);
      iVar20 = duckdb::ListVector::GetListSize(result);
      SelectionVector::Initialize(&sel,iVar20);
    }
    lVar30 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    local_160 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
    paVar34 = (anon_union_16_2_67f50693_for_value *)(lVar30 + 8);
    pTVar27 = (TemplatedValidityMask<unsigned_long> *)0x0;
    for (pUVar31 = (UnifiedVectorFormat *)0x0; pUVar3 != pUVar31; pUVar31 = pUVar31 + 1) {
      pUVar22 = pUVar31;
      if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
        pUVar22 = (UnifiedVectorFormat *)
                  (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                  (long)pUVar31 * 4);
      }
      pUVar33 = pUVar31;
      if (*(long *)_begin_data != 0) {
        pUVar33 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)_begin_data + (long)pUVar31 * 4);
      }
      pUVar26 = pUVar31;
      if (*(long *)_end_data != 0) {
        pUVar26 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)_end_data + (long)pUVar31 * 4);
      }
      if (local_1d0.ptr == (reference)0x0) {
        pUVar24 = (UnifiedVectorFormat *)0x0;
      }
      else {
        pUVar24 = pUVar31;
        if (*_step_data != 0) {
          pUVar24 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_step_data + (long)pUVar31 * 4);
        }
      }
      if (local_148 == 0) {
        bVar37 = false;
      }
      else {
        bVar37 = (*(ulong *)(local_148 + ((ulong)pUVar22 >> 6) * 8) >> ((ulong)pUVar22 & 0x3f) & 1)
                 == 0;
      }
      if (local_b0 == 0) {
        bVar38 = false;
      }
      else {
        bVar38 = (*(ulong *)(local_b0 + ((ulong)pUVar33 >> 6) * 8) >> ((ulong)pUVar33 & 0x3f) & 1)
                 == 0;
      }
      if (local_68 == 0) {
        bVar39 = false;
      }
      else {
        bVar39 = (*(ulong *)(local_68 + ((ulong)pUVar26 >> 6) * 8) >> ((ulong)pUVar26 & 0x3f) & 1)
                 == 0;
      }
      if (local_1d0.ptr == (reference)0x0) {
        bVar36 = false;
      }
      else if (local_f8 == 0) {
        bVar36 = true;
      }
      else {
        bVar36 = (*(ulong *)(local_f8 + ((ulong)pUVar24 >> 6) * 8) >> ((ulong)pUVar24 & 0x3f) & 1)
                 != 0;
      }
      if (((bVar37 || bVar38) || bVar39) || (local_1d0.ptr != (reference)0x0 && bVar36 == false)) {
        TemplatedValidityMask<unsigned_long>::SetInvalid(local_160,(idx_t)pUVar31);
      }
      else {
        puVar5 = (undefined8 *)(str.length + (long)pUVar22 * 0x10);
        uVar8 = *puVar5;
        sliced.length = puVar5[1];
        sliced.offset._0_4_ = (undefined4)uVar8;
        sliced.offset._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        if (FVar43 == (FunctionData)0x0) {
          iVar20 = *(idx_t *)(local_b8 + (long)pUVar33 * 8);
        }
        else {
          iVar20 = 0;
        }
        local_1a0 = iVar20;
        local_1b0 = paVar34;
        local_168 = pTVar27;
        if (FVar44 == (FunctionData)0x0) {
          local_1a8 = *(idx_t *)(local_70 + (long)pUVar26 * 8);
          iVar16 = local_1a8;
        }
        else {
          local_1a8 = StringSliceOperations::ValueLength((string_t *)&sliced);
          iVar16 = 0;
        }
        lVar30 = 1;
        if (local_1d0.ptr == (reference)0x0) {
LAB_0071fc86:
          ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                    ((string_t *)&sliced,(long *)&local_1a0,(long *)&local_1a8);
          bVar37 = true;
          iVar20 = local_1a0;
        }
        else {
          lVar30 = *(long *)(local_100 + (long)pUVar24 * 8);
          iVar15 = local_1a8;
          if ((lVar30 < 0) &&
             (iVar15 = iVar20, iVar20 = iVar16, local_1a0 = iVar16, FVar43 != (FunctionData)0x0)) {
            iVar15 = StringSliceOperations::ValueLength((string_t *)&sliced);
          }
          local_1a8 = iVar15;
          if ((~bVar36 & lVar30 != 1) == 0) goto LAB_0071fc86;
          bVar37 = false;
        }
        uVar7 = local_1a8;
        if ((long)iVar20 < (long)local_1a8) {
          iVar16 = CalculateSliceLength<long>(iVar20,local_1a8,lVar30,bVar36);
        }
        else {
          iVar16 = 0;
        }
        if (bVar37) {
          input_02.value._4_1_ = sliced.offset._4_1_;
          input_02.value._5_1_ = sliced.offset._5_1_;
          input_02.value._6_1_ = sliced.offset._6_1_;
          input_02.value._7_1_ = sliced.offset._7_1_;
          input_02.value.pointer.length = (undefined4)sliced.offset;
          input_02.value.pointer.ptr = (char *)sliced.length;
          input_01.value._4_1_ = sliced.offset._4_1_;
          input_01.value._5_1_ = sliced.offset._5_1_;
          input_01.value._6_1_ = sliced.offset._6_1_;
          input_01.value._7_1_ = sliced.offset._7_1_;
          input_01.value.pointer.length = (undefined4)sliced.offset;
          input_01.value.pointer.ptr = (char *)sliced.length;
          if (local_1d0.ptr == (reference)0x0) {
            aVar41.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringSliceOperations::SliceValue(result,input_02,iVar20,uVar7);
          }
          else {
            aVar41.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringSliceOperations::SliceValueWithSteps
                           (result,&sel,input_01,iVar20,uVar7,lVar30,&local_178);
          }
          *(long *)((long)local_1b0 + -8) = aVar41._0_8_;
          *(char **)local_1b0 = aVar41.pointer.ptr;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(local_160,(idx_t)pUVar31);
        }
        pTVar27 = (TemplatedValidityMask<unsigned_long> *)((long)&local_168->validity_mask + iVar16)
        ;
        paVar34 = local_1b0;
      }
      paVar34 = paVar34 + 1;
    }
    if (local_1d0.ptr != (reference)0x0) {
      SelectionVector::SelectionVector((SelectionVector *)&sliced,(idx_t)pTVar27);
      for (pTVar25 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar27 != pTVar25;
          pTVar25 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar25->validity_mask + 1)) {
        sVar32 = (sel_t)pTVar25;
        if (sel.sel_vector != (sel_t *)0x0) {
          sVar32 = sel.sel_vector[(long)pTVar25];
        }
        *(sel_t *)(CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) + (long)pTVar25 * 4) =
             sVar32;
      }
      pSVar21 = (SelectionVector *)optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
      duckdb::Vector::Slice(pSVar21,(ulong)&sliced);
      pVVar14 = optional_ptr<duckdb::Vector,_true>::operator->(&local_170);
      duckdb::Vector::Flatten((ulong)pVVar14);
      duckdb::ListVector::SetListSize(result,(ulong)pTVar27);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&step_data);
    UnifiedVectorFormat::~UnifiedVectorFormat(&end_data);
    UnifiedVectorFormat::~UnifiedVectorFormat(&begin_data);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&str);
  }
  duckdb::Vector::Verify((ulong)result);
LAB_00720593:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void ArraySliceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3 || args.ColumnCount() == 4);
	D_ASSERT(args.data.size() == 3 || args.data.size() == 4);
	auto count = args.size();

	Vector &list_or_str_vector = result;
	// this ensures that we do not change the input chunk
	VectorOperations::Copy(args.data[0], list_or_str_vector, count, 0, 0);

	if (list_or_str_vector.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	Vector &begin_vector = args.data[1];
	Vector &end_vector = args.data[2];

	optional_ptr<Vector> step_vector;
	if (args.ColumnCount() == 4) {
		step_vector = &args.data[3];
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSliceBindData>();
	auto begin_is_empty = info.begin_is_empty;
	auto end_is_empty = info.end_is_empty;

	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
	switch (result.GetType().id()) {
	case LogicalTypeId::LIST: {
		// Share the value dictionary as we are just going to slice it
		if (list_or_str_vector.GetVectorType() != VectorType::FLAT_VECTOR &&
		    list_or_str_vector.GetVectorType() != VectorType::CONSTANT_VECTOR) {
			list_or_str_vector.Flatten(count);
		}
		ExecuteSlice<list_entry_t, int64_t, ListSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                         step_vector, count, begin_is_empty, end_is_empty);
		break;
	}
	case LogicalTypeId::BLOB:
		ExecuteSlice<string_t, int64_t, BlobSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                     step_vector, count, begin_is_empty, end_is_empty);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteSlice<string_t, int64_t, StringSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                       step_vector, count, begin_is_empty, end_is_empty);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}